

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

void xmlInitializeCatalog(void)

{
  xmlCatalogPrefer xVar1;
  byte bVar2;
  char *pcVar3;
  byte *pbVar4;
  xmlCatalogPtr pxVar5;
  xmlChar *URL;
  xmlCatalogEntryPtr pxVar6;
  xmlCatalogEntryPtr pxVar7;
  byte *cur;
  long lVar8;
  
  if (xmlCatalogInitialized != '\0') {
    return;
  }
  xmlInitializeCatalogData();
  xmlRMutexLock(xmlCatalogMutex);
  pcVar3 = getenv("XML_DEBUG_CATALOG");
  if (pcVar3 != (char *)0x0) {
    xmlDebugCatalogs = 1;
  }
  pxVar5 = xmlDefaultCatalog;
  if (xmlDefaultCatalog == (xmlCatalogPtr)0x0) {
    pbVar4 = (byte *)getenv("XML_CATALOG_FILES");
    xVar1 = xmlCatalogDefaultPrefer;
    pxVar5 = (xmlCatalogPtr)(*xmlMalloc)(0x78);
    if (pxVar5 == (xmlCatalogPtr)0x0) {
      xmlCatalogErrMemory("allocating catalog");
      pxVar5 = xmlDefaultCatalog;
    }
    else {
      *(undefined8 *)pxVar5 = 0;
      pxVar5->catalTab[0] = (char *)0x0;
      pxVar5->catalTab[9] = (char *)0x0;
      pxVar5->catalNr = 0;
      pxVar5->catalMax = 0;
      pxVar5->sgml = (xmlHashTablePtr)0x0;
      *(undefined8 *)&pxVar5->prefer = 0;
      pxVar5->catalTab[7] = (char *)0x0;
      pxVar5->catalTab[8] = (char *)0x0;
      pxVar5->catalTab[5] = (char *)0x0;
      pxVar5->catalTab[6] = (char *)0x0;
      pxVar5->catalTab[3] = (char *)0x0;
      pxVar5->catalTab[4] = (char *)0x0;
      pxVar5->catalTab[1] = (char *)0x0;
      pxVar5->catalTab[2] = (char *)0x0;
      pxVar5->xml = (xmlCatalogEntryPtr)0x0;
      pxVar5->type = XML_XML_CATALOG_TYPE;
      pxVar5->catalMax = 10;
      pxVar5->prefer = xVar1;
      cur = (byte *)"file:///etc/xml/catalog";
      if (pbVar4 != (byte *)0x0) {
        cur = pbVar4;
      }
      bVar2 = *cur;
      if (bVar2 != 0) {
        pxVar7 = (xmlCatalogEntryPtr)&pxVar5->xml;
LAB_0013c054:
        do {
          if (bVar2 < 0x21) {
            if ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0) {
              bVar2 = cur[1];
              cur = cur + 1;
              goto LAB_0013c054;
            }
            if ((ulong)bVar2 != 0) goto LAB_0013c06f;
          }
          else {
LAB_0013c06f:
            lVar8 = 0;
            while ((0x20 < bVar2 || ((0x100002601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))) {
              bVar2 = cur[lVar8 + 1];
              lVar8 = lVar8 + 1;
            }
            URL = xmlStrndup(cur,(int)lVar8);
            cur = cur + lVar8;
            if (URL != (xmlChar *)0x0) {
              pxVar6 = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,(xmlChar *)0x0,URL,
                                          xmlCatalogDefaultPrefer,(xmlCatalogEntryPtr)0x0);
              pxVar7->next = pxVar6;
              if (pxVar6 != (xmlCatalogEntryPtr)0x0) {
                pxVar7 = pxVar6;
              }
              (*xmlFree)(URL);
            }
          }
          bVar2 = *cur;
        } while (bVar2 != 0);
      }
    }
  }
  xmlDefaultCatalog = pxVar5;
  xmlRMutexUnlock(xmlCatalogMutex);
  return;
}

Assistant:

void
xmlInitializeCatalog(void) {
    if (xmlCatalogInitialized != 0)
	return;

    xmlInitializeCatalogData();
    xmlRMutexLock(xmlCatalogMutex);

    if (getenv("XML_DEBUG_CATALOG"))
	xmlDebugCatalogs = 1;

    if (xmlDefaultCatalog == NULL) {
	const char *catalogs;
	char *path;
	const char *cur, *paths;
	xmlCatalogPtr catal;
	xmlCatalogEntryPtr *nextent;

	catalogs = (const char *) getenv("XML_CATALOG_FILES");
	if (catalogs == NULL)
#if defined(_WIN32) && defined(_MSC_VER)
    {
		void* hmodule;
		hmodule = GetModuleHandleA("libxml2.dll");
		if (hmodule == NULL)
			hmodule = GetModuleHandleA(NULL);
		if (hmodule != NULL) {
			char buf[256];
			unsigned long len = GetModuleFileNameA(hmodule, buf, 255);
			if (len != 0) {
				char* p = &(buf[len]);
				while (*p != '\\' && p > buf)
					p--;
				if (p != buf) {
					xmlChar* uri;
					strncpy(p, "\\..\\etc\\catalog", 255 - (p - buf));
					uri = xmlCanonicPath((const xmlChar*)buf);
					if (uri != NULL) {
						strncpy(XML_XML_DEFAULT_CATALOG, uri, 255);
						xmlFree(uri);
					}
				}
			}
		}
		catalogs = XML_XML_DEFAULT_CATALOG;
    }
#else
	    catalogs = XML_XML_DEFAULT_CATALOG;
#endif

	catal = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,
		xmlCatalogDefaultPrefer);
	if (catal != NULL) {
	    /* the XML_CATALOG_FILES envvar is allowed to contain a
	       space-separated list of entries. */
	    cur = catalogs;
	    nextent = &catal->xml;
	    while (*cur != '\0') {
		while (xmlIsBlank_ch(*cur))
		    cur++;
		if (*cur != 0) {
		    paths = cur;
		    while ((*cur != 0) && (!xmlIsBlank_ch(*cur)))
			cur++;
		    path = (char *) xmlStrndup((const xmlChar *)paths, cur - paths);
		    if (path != NULL) {
			*nextent = xmlNewCatalogEntry(XML_CATA_CATALOG, NULL,
				NULL, BAD_CAST path, xmlCatalogDefaultPrefer, NULL);
			if (*nextent != NULL)
			    nextent = &((*nextent)->next);
			xmlFree(path);
		    }
		}
	    }
	    xmlDefaultCatalog = catal;
	}
    }

    xmlRMutexUnlock(xmlCatalogMutex);
}